

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O3

BOOLEAN __thiscall BVFixed::TestAndClear(BVFixed *this,BVIndex i)

{
  BVFixed BVar1;
  byte bVar2;
  
  AssertRange(this,i);
  AssertRange(this,i);
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  BVar1 = this[(ulong)(i >> 6) + 1];
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  bVar2 = (byte)i & 0x3f;
  this[(ulong)(i >> 6) + 1] =
       (BVFixed)((ulong)this[(ulong)(i >> 6) + 1] &
                (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2));
  return ((ulong)BVar1 >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN
BVFixed::TestAndClear(BVIndex i)
{
    AssertRange(i);
    BVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex offset = BVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(offset);
    bvUnit->Clear(offset);
    return bit;
}